

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.cc
# Opt level: O0

Type __thiscall wabt::LocalTypes::operator[](LocalTypes *this,Index i)

{
  bool bVar1;
  reference ppVar2;
  pair<wabt::Type,_unsigned_int> decl;
  const_iterator __end1;
  const_iterator __begin1;
  Decls *__range1;
  Index count;
  Index i_local;
  LocalTypes *this_local;
  
  __range1._0_4_ = 0;
  __end1 = std::
           vector<std::pair<wabt::Type,_unsigned_int>,_std::allocator<std::pair<wabt::Type,_unsigned_int>_>_>
           ::begin(&this->decls_);
  decl._4_8_ = std::
               vector<std::pair<wabt::Type,_unsigned_int>,_std::allocator<std::pair<wabt::Type,_unsigned_int>_>_>
               ::end(&this->decls_);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<const_std::pair<wabt::Type,_unsigned_int>_*,_std::vector<std::pair<wabt::Type,_unsigned_int>,_std::allocator<std::pair<wabt::Type,_unsigned_int>_>_>_>
                                     *)&decl.first.type_index_), bVar1) {
    ppVar2 = __gnu_cxx::
             __normal_iterator<const_std::pair<wabt::Type,_unsigned_int>_*,_std::vector<std::pair<wabt::Type,_unsigned_int>,_std::allocator<std::pair<wabt::Type,_unsigned_int>_>_>_>
             ::operator*(&__end1);
    decl.first.enum_ = ppVar2->second;
    if (i < (uint)((uint)__range1 + decl.first.enum_)) {
      return ppVar2->first;
    }
    __range1._0_4_ = decl.first.enum_ + (uint)__range1;
    __gnu_cxx::
    __normal_iterator<const_std::pair<wabt::Type,_unsigned_int>_*,_std::vector<std::pair<wabt::Type,_unsigned_int>,_std::allocator<std::pair<wabt::Type,_unsigned_int>_>_>_>
    ::operator++(&__end1);
  }
  if (i < (uint)__range1) {
    Type::Type((Type *)&this_local,Any);
    return (Type)this_local;
  }
  __assert_fail("i < count",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/ir.cc",
                0xd1,"Type wabt::LocalTypes::operator[](Index) const");
}

Assistant:

Type LocalTypes::operator[](Index i) const {
  Index count = 0;
  for (auto decl : decls_) {
    if (i < count + decl.second) {
      return decl.first;
    }
    count += decl.second;
  }
  assert(i < count);
  return Type::Any;
}